

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_16x4_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  int8_t *piVar7;
  int16_t *piVar8;
  long lVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  long lVar11;
  undefined8 *puVar12;
  ulong uVar13;
  undefined8 *puVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined1 auVar19 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  code *local_248 [2];
  undefined8 local_238 [2];
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined1 local_218 [16];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined8 local_138 [6];
  undefined1 auStack_108 [16];
  undefined8 auStack_f8 [4];
  undefined8 auStack_d8 [2];
  undefined1 auStack_c8 [152];
  undefined1 auVar17 [12];
  undefined1 auVar22 [16];
  undefined1 auVar18 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [12];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  piVar7 = av1_fwd_txfm_shift_ls[0xe];
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_248[1] = *(code **)((long)col_txfm8x4_arr + uVar13);
  local_248[0] = *(code **)((long)row_txfm8x16_arr + uVar13);
  puVar14 = local_238;
  lVar9 = 0;
  do {
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar11 = 0x40;
      piVar8 = input;
      do {
        uVar3 = *(undefined8 *)(piVar8 + 4);
        *(undefined8 *)((long)local_248 + lVar11) = *(undefined8 *)piVar8;
        *(undefined8 *)((long)local_248 + lVar11 + 8) = uVar3;
        piVar8 = piVar8 + stride;
        lVar11 = lVar11 + -0x10;
      } while (lVar11 != 0);
    }
    else {
      lVar11 = 0;
      piVar8 = input;
      do {
        uVar3 = *(undefined8 *)(piVar8 + 4);
        *(undefined8 *)((long)local_238 + lVar11) = *(undefined8 *)piVar8;
        *(undefined8 *)((long)local_238 + lVar11 + 8) = uVar3;
        lVar11 = lVar11 + 0x10;
        piVar8 = piVar8 + stride;
      } while (lVar11 != 0x40);
    }
    bVar2 = *piVar7;
    uVar10 = (uint)(char)bVar2;
    if ((int)uVar10 < 0) {
      auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar24 = pshuflw(auVar24,auVar24,0);
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = auVar24._0_4_;
      auVar24._12_4_ = auVar24._0_4_;
      lVar11 = 0;
      do {
        auVar28 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar11),auVar24);
        auVar28 = psraw(auVar28,ZEXT416(-uVar10));
        *(undefined1 (*) [16])((long)local_238 + lVar11) = auVar28;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
    }
    else if (bVar2 != 0) {
      lVar11 = 0;
      do {
        auVar24 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar11),ZEXT416(uVar10));
        *(undefined1 (*) [16])((long)local_238 + lVar11) = auVar24;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
    }
    (*local_248[1])(puVar14,puVar14,0xd);
    bVar2 = piVar7[1];
    uVar10 = (uint)(char)bVar2;
    if ((int)uVar10 < 0) {
      auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar24 = pshuflw(auVar24,auVar24,0);
      auVar28._0_4_ = auVar24._0_4_;
      auVar28._4_4_ = auVar28._0_4_;
      auVar28._8_4_ = auVar28._0_4_;
      auVar28._12_4_ = auVar28._0_4_;
      lVar11 = 0;
      do {
        auVar24 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar11),auVar28);
        auVar24 = psraw(auVar24,ZEXT416(-uVar10));
        *(undefined1 (*) [16])((long)local_238 + lVar11) = auVar24;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
    }
    else if (bVar2 != 0) {
      lVar11 = 0;
      do {
        auVar24 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar11),ZEXT416(uVar10));
        *(undefined1 (*) [16])((long)local_238 + lVar11) = auVar24;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
    }
    lVar11 = lVar9 * 0x80;
    auVar34._0_12_ = local_238._0_12_;
    auVar34._12_2_ = local_238[0]._6_2_;
    auVar34._14_2_ = uStack_222;
    auVar33._12_4_ = auVar34._12_4_;
    auVar33._0_10_ = local_238._0_10_;
    auVar33._10_2_ = uStack_224;
    auVar32._10_6_ = auVar33._10_6_;
    auVar32._0_8_ = local_238[0];
    auVar32._8_2_ = local_238[0]._4_2_;
    auVar4._4_8_ = auVar32._8_8_;
    auVar4._2_2_ = uStack_226;
    auVar4._0_2_ = local_238[0]._2_2_;
    auVar31._0_4_ = CONCAT22(local_228,(short)local_238[0]);
    auVar31._4_12_ = auVar4;
    auVar38._0_12_ = local_218._0_12_;
    auVar38._12_2_ = local_218._6_2_;
    auVar38._14_2_ = uStack_202;
    auVar37._12_4_ = auVar38._12_4_;
    auVar37._0_10_ = local_218._0_10_;
    auVar37._10_2_ = uStack_204;
    auVar36._10_6_ = auVar37._10_6_;
    auVar36._0_8_ = local_218._0_8_;
    auVar36._8_2_ = local_218._4_2_;
    auVar5._4_8_ = auVar36._8_8_;
    auVar5._2_2_ = uStack_206;
    auVar5._0_2_ = local_218._2_2_;
    uVar16 = CONCAT22(uStack_220,(short)local_238[1]);
    auVar17._0_8_ = CONCAT26(uStack_21e,CONCAT24(local_238[1]._2_2_,uVar16));
    auVar17._8_2_ = local_238[1]._4_2_;
    auVar17._10_2_ = uStack_21c;
    auVar18._12_2_ = local_238[1]._6_2_;
    auVar18._0_12_ = auVar17;
    auVar18._14_2_ = uStack_21a;
    uVar26 = CONCAT22(uStack_200,local_218._8_2_);
    auVar27._0_8_ = CONCAT26(uStack_1fe,CONCAT24(local_218._10_2_,uVar26));
    auVar27._8_2_ = local_218._12_2_;
    auVar27._10_2_ = uStack_1fc;
    auVar29._12_2_ = local_218._14_2_;
    auVar29._0_12_ = auVar27;
    auVar29._14_2_ = uStack_1fa;
    auVar25._0_8_ = auVar31._0_8_;
    auVar25._8_4_ = auVar4._0_4_;
    auVar25._12_4_ = auVar5._0_4_;
    auVar30._8_4_ = (int)((ulong)auVar17._0_8_ >> 0x20);
    auVar30._0_8_ = auVar17._0_8_;
    auVar30._12_4_ = (int)((ulong)auVar27._0_8_ >> 0x20);
    auVar35._0_8_ = CONCAT44(auVar36._8_4_,auVar32._8_4_);
    auVar35._8_4_ = auVar33._12_4_;
    auVar35._12_4_ = auVar37._12_4_;
    auVar19._0_8_ = CONCAT44(auVar27._8_4_,auVar17._8_4_);
    auVar19._8_4_ = auVar18._12_4_;
    auVar19._12_4_ = auVar29._12_4_;
    local_138[lVar9 * 0x10] = CONCAT44(CONCAT22(local_208,local_218._0_2_),auVar31._0_4_);
    local_138[lVar9 * 0x10 + 1] = 0;
    local_138[lVar9 * 0x10 + 2] = auVar25._8_8_;
    local_138[lVar9 * 0x10 + 3] = 0;
    *(undefined8 *)(auStack_108 + lVar11 + -0x10) = auVar35._0_8_;
    *(undefined8 *)(auStack_108 + lVar11 + -8) = 0;
    *(undefined1 (*) [16])(auStack_108 + lVar11) = auVar35 >> 0x40;
    auStack_f8[lVar9 * 0x10] = CONCAT44(uVar26,uVar16);
    auStack_f8[lVar9 * 0x10 + 1] = 0;
    auStack_f8[lVar9 * 0x10 + 2] = auVar30._8_8_;
    auStack_f8[lVar9 * 0x10 + 3] = 0;
    *(undefined8 *)(auStack_c8 + lVar11 + -0x10) = auVar19._0_8_;
    *(undefined8 *)(auStack_c8 + lVar11 + -8) = 0;
    *(undefined1 (*) [16])(auStack_c8 + lVar11) = auVar19 >> 0x40;
    input = input + 8;
    bVar15 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar15);
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar9 = 0x100;
    puVar12 = local_138;
    do {
      uVar3 = puVar12[1];
      *(undefined8 *)((long)local_248 + lVar9) = *puVar12;
      *(undefined8 *)((long)local_248 + lVar9 + 8) = uVar3;
      puVar12 = puVar12 + 2;
      lVar9 = lVar9 + -0x10;
    } while (lVar9 != 0);
  }
  else {
    puVar14 = local_138;
  }
  auVar20._0_8_ = (*local_248[0])(puVar14,puVar14,0xd);
  auVar20._8_8_ = extraout_XMM0_Qb;
  bVar2 = piVar7[2];
  if ((char)bVar2 < '\0') {
    auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar20._0_4_ = auVar24._0_4_;
    auVar20._4_4_ = auVar20._0_4_;
    auVar20._8_4_ = auVar20._0_4_;
    auVar20._12_4_ = auVar20._0_4_;
    lVar9 = 0;
    do {
      auVar24 = paddsw(*(undefined1 (*) [16])((long)puVar14 + lVar9),auVar20);
      auVar24 = psraw(auVar24,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar14 + lVar9) = auVar24;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x100);
  }
  else if (bVar2 != 0) {
    lVar9 = 0;
    auVar20 = ZEXT416((uint)(int)(char)bVar2);
    do {
      auVar24 = psllw(*(undefined1 (*) [16])((long)puVar14 + lVar9),auVar20);
      *(undefined1 (*) [16])((long)puVar14 + lVar9) = auVar24;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x100);
  }
  lVar9 = 0;
  do {
    psVar1 = (short *)((long)puVar14 + lVar9);
    auVar23._0_12_ = auVar20._0_12_;
    auVar23._12_2_ = auVar20._6_2_;
    auVar23._14_2_ = psVar1[3];
    auVar22._12_4_ = auVar23._12_4_;
    auVar22._0_10_ = auVar20._0_10_;
    auVar22._10_2_ = psVar1[2];
    auVar21._10_6_ = auVar22._10_6_;
    auVar21._0_8_ = auVar20._0_8_;
    auVar21._8_2_ = auVar20._4_2_;
    auVar6._4_8_ = auVar21._8_8_;
    auVar6._2_2_ = psVar1[1];
    auVar6._0_2_ = auVar20._2_2_;
    auVar20._0_4_ = (int)*psVar1;
    auVar20._4_4_ = auVar6._0_4_ >> 0x10;
    auVar20._8_4_ = auVar21._8_4_ >> 0x10;
    auVar20._12_4_ = auVar22._12_4_ >> 0x10;
    *(undefined1 (*) [16])((long)output + lVar9) = auVar20;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x100);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x4_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm8x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x4(buf0, buf1 + 8 * i);
  }

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w4(buf, output, height, width);
}